

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mem.cpp
# Opt level: O1

size_t crnlib::crnlib_msize(void *p)

{
  size_t sVar1;
  
  if (p != (void *)0x0) {
    if (((ulong)p & 0xf) == 0) {
      sVar1 = (*(code *)g_pMSize)(p,g_pUser_data);
      return sVar1;
    }
    crnlib_assert("crnlib_msize: bad ptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DaemonEngine[P]crunch/crnlib/crn_mem.cpp"
                  ,0x82);
  }
  return 0;
}

Assistant:

size_t crnlib_msize(void* p) {
  if (!p)
    return 0;

  if (reinterpret_cast<ptr_bits_t>(p) & (CRNLIB_MIN_ALLOC_ALIGNMENT - 1)) {
    crnlib_mem_error("crnlib_msize: bad ptr");
    return 0;
  }

  return (*g_pMSize)(p, g_pUser_data);
}